

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

void __thiscall re2::Regexp::Walker<int>::Reset(Walker<int> *this)

{
  stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
  *psVar1;
  _Map_pointer ppWVar2;
  WalkState<int> *pWVar3;
  WalkState<int> *pWVar4;
  LogMessage local_190;
  
  psVar1 = this->stack_;
  if ((psVar1 != (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                  *)0x0) &&
     (ppWVar2 = (psVar1->c).
                super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node,
     ((long)(psVar1->c).
            super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
            super__Deque_impl_data._M_start._M_last -
      (long)(psVar1->c).
            super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur >> 5) +
     ((long)(psVar1->c).
            super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur -
      (long)(psVar1->c).
            super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first >> 5) +
     ((((ulong)((long)ppWVar2 -
               (long)(psVar1->c).
                     super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
     (ulong)(ppWVar2 == (_Map_pointer)0x0)) * 0x10 != 0)) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0x93,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Stack not empty.",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
    while( true ) {
      psVar1 = this->stack_;
      ppWVar2 = (psVar1->c).
                super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      pWVar4 = (psVar1->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_finish._M_cur;
      pWVar3 = (psVar1->c).
               super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>._M_impl
               .super__Deque_impl_data._M_finish._M_first;
      if (((long)(psVar1->c).
                 super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(psVar1->c).
                 super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)pWVar4 - (long)pWVar3 >> 5) +
          ((((ulong)((long)ppWVar2 -
                    (long)(psVar1->c).
                          super__Deque_base<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppWVar2 == (_Map_pointer)0x0)) * 0x10 == 0) break;
      if (pWVar4 == pWVar3) {
        pWVar4 = ppWVar2[-1] + 0x10;
      }
      if (pWVar4[-1].child_args != (int *)0x0) {
        operator_delete(pWVar4[-1].child_args);
      }
      std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>::pop_back
                (&this->stack_->c);
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (stack_ && stack_->size() > 0) {
    LOG(DFATAL) << "Stack not empty.";
    while (stack_->size() > 0) {
      delete stack_->top().child_args;
      stack_->pop();
    }
  }
}